

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kernel.cpp
# Opt level: O3

void __thiscall Kernel::print(Kernel *this)

{
  long lVar1;
  bool bVar2;
  long *plVar3;
  undefined8 *puVar4;
  int iVar5;
  int iVar6;
  long *plVar7;
  int iVar8;
  int iVar9;
  long *local_70;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar5 = this->height / 2;
  iVar9 = -iVar5;
  if (iVar9 == iVar5 || SBORROW4(iVar9,iVar5) != iVar5 * -2 < 0) {
    do {
      *(undefined8 *)(malloc + *(long *)(std::cout + -0x18)) = 0xc;
      if (iVar9 == 0) {
        __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                  (&local_50,vsnprintf,0x3a,"%f",SUB84((double)this->scale,0));
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
        plVar7 = plVar3 + 2;
        if ((long *)*plVar3 == plVar7) {
          local_60 = *plVar7;
          lStack_58 = plVar3[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar7;
          local_70 = (long *)*plVar3;
        }
        lVar1 = plVar3[1];
        *plVar3 = (long)plVar7;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)local_70,lVar1);
        if (local_70 != &local_60) {
          operator_delete(local_70);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"",0);
      }
      iVar5 = this->width;
      iVar6 = iVar5 / 2;
      iVar8 = -iVar6;
      if (iVar8 == iVar6 || SBORROW4(iVar8,iVar6) != iVar6 * -2 < 0) {
        do {
          *(undefined8 *)(malloc + *(long *)(std::cout + -0x18)) = 0xc;
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_50,vsnprintf,0x3a,"%f",
                     SUB84((double)(this->weights).super__Vector_base<float,_std::allocator<float>_>
                                   ._M_impl.super__Vector_impl_data._M_start
                                   [(this->yoff + iVar9) * iVar5 + this->xoff + iVar8],0));
          puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
          plVar3 = puVar4 + 2;
          if ((long *)*puVar4 == plVar3) {
            local_60 = *plVar3;
            lStack_58 = puVar4[3];
            local_70 = &local_60;
          }
          else {
            local_60 = *plVar3;
            local_70 = (long *)*puVar4;
          }
          lVar1 = puVar4[1];
          *puVar4 = plVar3;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)local_70,lVar1);
          if (local_70 != &local_60) {
            operator_delete(local_70);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          iVar5 = this->width;
          bVar2 = iVar8 < iVar5 / 2;
          iVar8 = iVar8 + 1;
        } while (bVar2);
      }
      bVar2 = iVar9 < this->height / 2;
      iVar9 = iVar9 + 1;
    } while (bVar2);
  }
  return;
}

Assistant:

void Kernel::print() {
  for (int y = -height / 2; y <= height / 2; y++) {
    if (y == 0) {
      std::cout << std::setw(12) << (std::to_string(scale) + " x ");
    } else {
      std::cout << std::setw(12) << "";
    }
    for (int x = -width / 2; x <= width / 2; x++) {
      std::cout << std::setw(12) << (std::to_string(this->operator()(x, y)) + (x != width / 2 ? ", " : "\n"));
    }
  }
}